

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O3

int backward(int menu)

{
  menuwindow *pmVar1;
  menustate *pmVar2;
  Fl_Menu_Item *pFVar3;
  int *piVar4;
  int n;
  
  pmVar2 = p;
  pmVar1 = p->p[menu];
  piVar4 = &pmVar1->selected;
  if (p->menu_number == menu) {
    piVar4 = &p->item_number;
  }
  n = *piVar4;
  if (n < 0) {
    n = pmVar1->numitems;
  }
  do {
    if (n < 1) {
      return 0;
    }
    n = n + -1;
    pFVar3 = Fl_Menu_Item::next(pmVar1->menu,n);
  } while ((pFVar3->flags & 0x11) != 0);
  pmVar2->current_item = pFVar3;
  pmVar2->menu_number = menu;
  pmVar2->item_number = n;
  return 1;
}

Assistant:

static int backward(int menu) { // previous item in menu menu if possible
  menustate &pp = *p;
  menuwindow &m = *(pp.p[menu]);
  int item = (menu == pp.menu_number) ? pp.item_number : m.selected;
  if (item < 0) item = m.numitems;
  while (--item >= 0) {
    const Fl_Menu_Item* m1 = m.menu->next(item);
    if (m1->activevisible()) {setitem(m1, menu, item); return 1;}
  }
  return 0;
}